

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

ScriptWitness * __thiscall
cfd::core::Transaction::AddScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,Transaction *this,uint32_t tx_in_index,
          ByteData160 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ScriptWitness local_40;
  
  ByteData160::GetBytes(&local_58,data);
  AddScriptWitnessStack(&local_40,this,tx_in_index,&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,8);
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0025acc0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,&local_40.witness_stack_);
  local_40._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0025acc0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_40.witness_stack_);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness Transaction::AddScriptWitnessStack(
    uint32_t tx_in_index, const ByteData160 &data) {
  const ScriptWitness &witness =
      AddScriptWitnessStack(tx_in_index, data.GetBytes());
  CallbackStateChange(kStateChangeUpdateSignTxIn);
  return witness;
}